

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>::ModeRm
          (ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *this,
          idx_t frame)

{
  DataChunk *result;
  ColumnDataScanState *state;
  size_t sVar1;
  interval_t *piVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  long lVar5;
  long lVar6;
  key_type *__k;
  
  state = this->scan;
  if ((state->next_row_index <= frame) || (frame < state->current_row_index)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,frame,state,result);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (interval_t *)pvVar3->data;
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar3);
    this->validity = &pvVar3->validity;
  }
  __k = this->data + (uint)((int)frame - (int)this->scan->current_row_index);
  pmVar4 = ::std::__detail::
           _Map_base<duckdb::interval_t,_std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::interval_t>,_std::hash<duckdb::interval_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::interval_t,_std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::interval_t>,_std::hash<duckdb::interval_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar1 = pmVar4->count;
  this->nonzero = this->nonzero - (ulong)(sVar1 == 1);
  pmVar4->count = sVar1 - 1;
  if (this->count == sVar1) {
    piVar2 = this->mode;
    if (((__k->months != piVar2->months) || (__k->days != piVar2->days)) ||
       (__k->micros != piVar2->micros)) {
      lVar5 = (long)__k->days + __k->micros / 86400000000;
      lVar6 = (long)piVar2->days + piVar2->micros / 86400000000;
      if ((long)__k->months + lVar5 / 0x1e != (long)piVar2->months + lVar6 / 0x1e) {
        return;
      }
      if (lVar5 % 0x1e != lVar6 % 0x1e) {
        return;
      }
      if (__k->micros % 86400000000 != piVar2->micros % 86400000000) {
        return;
      }
    }
    this->valid = false;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}